

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdClient.hpp
# Opt level: O0

void __thiscall
Statsd::StatsdClient::StatsdClient
          (StatsdClient *this,string *host,uint16_t port,string *prefix,uint64_t batchsize,
          uint64_t sendInterval,int gaugePrecision)

{
  result_type_conflict seed;
  UDPSender *this_00;
  random_device local_13e0;
  string local_58 [32];
  uint64_t local_38;
  uint64_t sendInterval_local;
  uint64_t batchsize_local;
  string *prefix_local;
  string *psStack_18;
  uint16_t port_local;
  string *host_local;
  StatsdClient *this_local;
  
  local_38 = sendInterval;
  sendInterval_local = batchsize;
  batchsize_local = (uint64_t)prefix;
  prefix_local._6_2_ = port;
  psStack_18 = host;
  host_local = &this->m_prefix;
  std::__cxx11::string::string(local_58,(string *)prefix);
  detail::sanitizePrefix((detail *)this,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  this_00 = (UDPSender *)operator_new(0xf0);
  UDPSender::UDPSender(this_00,psStack_18,prefix_local._6_2_,sendInterval_local,local_38);
  std::unique_ptr<Statsd::UDPSender,std::default_delete<Statsd::UDPSender>>::
  unique_ptr<std::default_delete<Statsd::UDPSender>,void>
            ((unique_ptr<Statsd::UDPSender,std::default_delete<Statsd::UDPSender>> *)&this->m_sender
             ,this_00);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->m_randomEngine);
  this->m_gaugePrecision = gaugePrecision;
  std::random_device::random_device(&local_13e0);
  seed = std::random_device::operator()(&local_13e0);
  StatsdClient::seed(this,seed);
  std::random_device::~random_device(&local_13e0);
  return;
}

Assistant:

inline StatsdClient::StatsdClient(const std::string& host,
                                  const uint16_t port,
                                  const std::string& prefix,
                                  const uint64_t batchsize,
                                  const uint64_t sendInterval,
                                  const int gaugePrecision) noexcept
    : m_prefix(detail::sanitizePrefix(prefix)),
      m_sender(new UDPSender{host, port, batchsize, sendInterval}),
      m_gaugePrecision(gaugePrecision) {
    // Initialize the random generator to be used for sampling
    seed();
}